

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpo.c
# Opt level: O1

Literal_t *
Rpo_Recursion(uint *target,Literal_t **vecLit,int nLit,int nLitCount,int nVars,int *thresholdCount,
             int thresholdMax,int verbose)

{
  char cVar1;
  Rpo_LCI_Edge_t RVar2;
  uint *puVar3;
  uint *puVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  int *vertexDegree;
  Rpo_LCI_Edge_t **edges;
  Rpo_LCI_Edge_t *pRVar9;
  Literal_t *pLVar10;
  uint *puVar11;
  Vec_Str_t *pVVar12;
  uint *puVar13;
  Vec_Str_t *pVVar14;
  char *pcVar15;
  Literal_t *__ptr;
  Literal_t *pLVar16;
  ulong uVar17;
  long lVar18;
  long lVar19;
  uint uVar20;
  ulong uVar21;
  long lVar22;
  long lVar23;
  uint uVar24;
  char *pcVar25;
  int iVar26;
  int level;
  Literal_t *pLVar27;
  Rpo_LCI_Edge_t **ppRVar28;
  size_t sVar29;
  undefined8 uVar30;
  long lVar31;
  size_t sVar32;
  ulong uVar33;
  ulong uVar34;
  uint local_cc;
  Literal_t **local_c8;
  int *local_b0;
  char local_90;
  ulong local_70;
  
  uVar34 = (ulong)(uint)nLit;
  iVar6 = *thresholdCount;
  *thresholdCount = iVar6 + 1;
  if (iVar6 + 1 != thresholdMax) {
    puVar11 = target;
    if (verbose != 0) {
      Abc_Print((int)target,"Entering recursion %d\n");
    }
    if (nLitCount != 1) {
      vertexDegree = (int *)malloc((long)nLit * 4);
      if (0 < nLit) {
        memset(vertexDegree,0,uVar34 * 4);
      }
      pLVar27 = (Literal_t *)((long)(((nLit + -1) * nLit) / 2) << 3);
      edges = (Rpo_LCI_Edge_t **)malloc((size_t)pLVar27);
      if (verbose != 0) {
        Abc_Print((int)pLVar27,"Creating Edges: \n");
      }
      iVar6 = (int)pLVar27;
      if (nLit < 1) {
        local_cc = 0;
      }
      else {
        lVar19 = 2;
        lVar22 = 4;
        uVar17 = 0;
        local_cc = 0;
        local_c8 = vecLit;
        local_b0 = vertexDegree;
        local_70 = uVar34;
        do {
          if (vecLit[uVar17] != (Literal_t *)0x0) {
            lVar23 = (ulong)((uint)uVar17 & 0x3fffffff) * 0x10;
            lVar31 = lVar19 + lVar23;
            lVar23 = lVar23 + lVar22;
            uVar33 = 0;
            do {
              if (local_c8[uVar33] != (Literal_t *)0x0) {
                iVar6 = Rpo_CheckANDGroup(vecLit[uVar17],local_c8[uVar33],nVars);
                pLVar27 = vecLit[uVar17];
                iVar7 = Rpo_CheckORGroup(pLVar27,local_c8[uVar33],nVars);
                iVar26 = (int)pLVar27;
                if (iVar6 != 0) {
                  if (verbose != 0) {
                    Abc_Print(iVar26,"Grouped: ");
                    Abc_Print(iVar26,"%s",local_c8[uVar33]->expression->pArray);
                    Abc_Print(iVar26," AND ");
                    Abc_Print(iVar26,"%s",vecLit[uVar17]->expression->pArray);
                    Abc_Print(iVar26,"\n");
                  }
                  pLVar27 = (Literal_t *)&DAT_00000008;
                  pRVar9 = (Rpo_LCI_Edge_t *)malloc(8);
                  RVar2 = *pRVar9;
                  vertexDegree[uVar17] = vertexDegree[uVar17] + 1;
                  local_b0[uVar33] = local_b0[uVar33] + 1;
                  *pRVar9 = (Rpo_LCI_Edge_t)((ulong)(RVar2._0_4_ & 8) + lVar31);
                  lVar18 = (long)(int)local_cc;
                  local_cc = local_cc + 1;
                  edges[lVar18] = pRVar9;
                }
                iVar6 = (int)pLVar27;
                if (iVar7 != 0) {
                  if (verbose != 0) {
                    Abc_Print(iVar6,"Grouped: ");
                    Abc_Print(iVar6,"%s",local_c8[uVar33]->expression->pArray);
                    Abc_Print(iVar6," OR ");
                    Abc_Print(iVar6,"%s",vecLit[uVar17]->expression->pArray);
                    Abc_Print(iVar6,"\n");
                  }
                  pLVar27 = (Literal_t *)&DAT_00000008;
                  pRVar9 = (Rpo_LCI_Edge_t *)malloc(8);
                  RVar2 = *pRVar9;
                  vertexDegree[uVar17] = vertexDegree[uVar17] + 1;
                  local_b0[uVar33] = local_b0[uVar33] + 1;
                  *pRVar9 = (Rpo_LCI_Edge_t)((ulong)(RVar2._0_4_ & 8) + lVar23);
                  lVar18 = (long)(int)local_cc;
                  local_cc = local_cc + 1;
                  edges[lVar18] = pRVar9;
                }
              }
              uVar33 = uVar33 + 1;
              lVar31 = lVar31 + 0x400000000;
              lVar23 = lVar23 + 0x400000000;
            } while (local_70 != uVar33);
          }
          iVar6 = (int)pLVar27;
          uVar17 = uVar17 + 1;
          local_c8 = local_c8 + 1;
          local_b0 = local_b0 + 1;
          lVar19 = lVar19 + 0x400000000;
          lVar22 = lVar22 + 0x400000000;
          local_70 = local_70 - 1;
        } while (uVar17 != uVar34);
      }
      if (verbose != 0) {
        Abc_Print(iVar6,"%d edges created.\n",(ulong)local_cc);
      }
      uVar5 = 1 << ((char)nVars - 5U & 0x1f);
      if (nVars < 6) {
        uVar5 = 1;
      }
      lVar19 = (ulong)uVar5 + 1;
      while (ppRVar28 = edges, uVar8 = Rpo_computeMinEdgeCost(edges,local_cc,vertexDegree),
            -1 < (int)uVar8) {
        RVar2 = *edges[uVar8];
        uVar24 = (uint)((ulong)RVar2 >> 4) & 0x3fffffff;
        uVar20 = RVar2._4_4_ >> 2;
        uVar34 = (ulong)RVar2 >> 0x22;
        if (uVar24 < uVar20) {
          uVar34 = (ulong)uVar24;
        }
        uVar17 = (ulong)uVar24;
        if (uVar24 <= uVar20) {
          uVar17 = (ulong)RVar2 >> 0x22;
        }
        *edges[uVar8] = (Rpo_LCI_Edge_t)((ulong)RVar2 | 1);
        pLVar27 = vecLit[uVar34];
        pLVar10 = vecLit[uVar17];
        puVar11 = (uint *)malloc((long)(int)uVar5 << 2);
        puVar13 = (uint *)malloc((long)(int)uVar5 << 2);
        iVar6 = pLVar27->expression->nSize;
        iVar7 = pLVar10->expression->nSize;
        level = 0x10;
        pVVar14 = (Vec_Str_t *)malloc(0x10);
        iVar26 = iVar7 + iVar6 + 3;
        if (iVar7 + iVar6 + 2U < 0xf) {
          iVar26 = 0x10;
        }
        pVVar14->nSize = 0;
        pVVar14->nCap = iVar26;
        if (iVar26 == 0) {
          pcVar25 = (char *)0x0;
        }
        else {
          sVar29 = (size_t)iVar26;
          pcVar25 = (char *)malloc(sVar29);
          level = (int)sVar29;
        }
        uVar8 = (uint)((ulong)RVar2 >> 1) & 3;
        pVVar14->pArray = pcVar25;
        if (uVar8 == 2) {
          local_90 = '+';
          if (0 < (int)uVar5) {
            puVar3 = pLVar27->function;
            puVar4 = pLVar10->function;
            lVar22 = lVar19;
            do {
              puVar11[lVar22 + -2] = puVar4[lVar22 + -2] | puVar3[lVar22 + -2];
              lVar22 = lVar22 + -1;
            } while (1 < lVar22);
          }
        }
        else if (uVar8 == 1) {
          local_90 = '*';
          if (0 < (int)uVar5) {
            puVar3 = pLVar27->function;
            puVar4 = pLVar10->function;
            lVar22 = lVar19;
            do {
              puVar11[lVar22 + -2] = puVar4[lVar22 + -2] & puVar3[lVar22 + -2];
              lVar22 = lVar22 + -1;
            } while (1 < lVar22);
          }
        }
        else {
          Abc_Print(level,"Lit_GroupLiterals with op not defined.");
          local_90 = '%';
        }
        if (0 < (int)uVar5) {
          puVar3 = pLVar27->transition;
          puVar4 = pLVar10->transition;
          lVar22 = lVar19;
          do {
            puVar13[lVar22 + -2] = puVar4[lVar22 + -2] | puVar3[lVar22 + -2];
            lVar22 = lVar22 + -1;
          } while (1 < lVar22);
        }
        uVar8 = pVVar14->nCap;
        if (pVVar14->nSize == uVar8) {
          if ((int)uVar8 < 0x10) {
            if (pVVar14->pArray == (char *)0x0) {
              pcVar25 = (char *)malloc(0x10);
            }
            else {
              pcVar25 = (char *)realloc(pVVar14->pArray,0x10);
            }
            sVar29 = 0x10;
          }
          else {
            sVar29 = (ulong)uVar8 * 2;
            if ((int)sVar29 <= (int)uVar8) goto LAB_00569865;
            if (pVVar14->pArray == (char *)0x0) {
              pcVar25 = (char *)malloc(sVar29);
            }
            else {
              pcVar25 = (char *)realloc(pVVar14->pArray,sVar29);
            }
          }
          pVVar14->pArray = pcVar25;
          pVVar14->nCap = (int)sVar29;
        }
LAB_00569865:
        iVar6 = pVVar14->nSize;
        pVVar14->nSize = iVar6 + 1;
        pVVar14->pArray[iVar6] = '(';
        pcVar25 = pLVar27->expression->pArray;
        sVar29 = strlen(pcVar25);
        if (0 < (int)(uint)sVar29) {
          uVar33 = 0;
          do {
            cVar1 = pcVar25[uVar33];
            uVar8 = pVVar14->nCap;
            if (pVVar14->nSize == uVar8) {
              if ((int)uVar8 < 0x10) {
                if (pVVar14->pArray == (char *)0x0) {
                  pcVar15 = (char *)malloc(0x10);
                }
                else {
                  pcVar15 = (char *)realloc(pVVar14->pArray,0x10);
                }
                sVar32 = 0x10;
              }
              else {
                sVar32 = (ulong)uVar8 * 2;
                if ((int)sVar32 <= (int)uVar8) goto LAB_00569901;
                if (pVVar14->pArray == (char *)0x0) {
                  pcVar15 = (char *)malloc(sVar32);
                }
                else {
                  pcVar15 = (char *)realloc(pVVar14->pArray,sVar32);
                }
              }
              pVVar14->pArray = pcVar15;
              pVVar14->nCap = (int)sVar32;
            }
LAB_00569901:
            iVar6 = pVVar14->nSize;
            pVVar14->nSize = iVar6 + 1;
            pVVar14->pArray[iVar6] = cVar1;
            uVar33 = uVar33 + 1;
          } while (((uint)sVar29 & 0x7fffffff) != uVar33);
        }
        uVar8 = pVVar14->nCap;
        if (pVVar14->nSize == uVar8) {
          if ((int)uVar8 < 0x10) {
            if (pVVar14->pArray == (char *)0x0) {
              pcVar25 = (char *)malloc(0x10);
            }
            else {
              pcVar25 = (char *)realloc(pVVar14->pArray,0x10);
            }
            sVar29 = 0x10;
          }
          else {
            sVar29 = (ulong)uVar8 * 2;
            if ((int)sVar29 <= (int)uVar8) goto LAB_0056997f;
            if (pVVar14->pArray == (char *)0x0) {
              pcVar25 = (char *)malloc(sVar29);
            }
            else {
              pcVar25 = (char *)realloc(pVVar14->pArray,sVar29);
            }
          }
          pVVar14->pArray = pcVar25;
          pVVar14->nCap = (int)sVar29;
        }
LAB_0056997f:
        iVar6 = pVVar14->nSize;
        pVVar14->nSize = iVar6 + 1;
        pVVar14->pArray[iVar6] = local_90;
        pcVar25 = pLVar10->expression->pArray;
        sVar29 = strlen(pcVar25);
        if (0 < (int)(uint)sVar29) {
          uVar33 = 0;
          do {
            cVar1 = pcVar25[uVar33];
            uVar8 = pVVar14->nCap;
            if (pVVar14->nSize == uVar8) {
              if ((int)uVar8 < 0x10) {
                if (pVVar14->pArray == (char *)0x0) {
                  pcVar15 = (char *)malloc(0x10);
                }
                else {
                  pcVar15 = (char *)realloc(pVVar14->pArray,0x10);
                }
                sVar32 = 0x10;
              }
              else {
                sVar32 = (ulong)uVar8 * 2;
                if ((int)sVar32 <= (int)uVar8) goto LAB_00569a1e;
                if (pVVar14->pArray == (char *)0x0) {
                  pcVar15 = (char *)malloc(sVar32);
                }
                else {
                  pcVar15 = (char *)realloc(pVVar14->pArray,sVar32);
                }
              }
              pVVar14->pArray = pcVar15;
              pVVar14->nCap = (int)sVar32;
            }
LAB_00569a1e:
            iVar6 = pVVar14->nSize;
            pVVar14->nSize = iVar6 + 1;
            pVVar14->pArray[iVar6] = cVar1;
            uVar33 = uVar33 + 1;
          } while (((uint)sVar29 & 0x7fffffff) != uVar33);
        }
        uVar8 = pVVar14->nCap;
        if (pVVar14->nSize == uVar8) {
          if ((int)uVar8 < 0x10) {
            if (pVVar14->pArray == (char *)0x0) {
              pcVar25 = (char *)malloc(0x10);
            }
            else {
              pcVar25 = (char *)realloc(pVVar14->pArray,0x10);
            }
            sVar29 = 0x10;
          }
          else {
            sVar29 = (ulong)uVar8 * 2;
            if ((int)sVar29 <= (int)uVar8) goto LAB_00569aab;
            if (pVVar14->pArray == (char *)0x0) {
              pcVar25 = (char *)malloc(sVar29);
            }
            else {
              pcVar25 = (char *)realloc(pVVar14->pArray,sVar29);
            }
          }
          pVVar14->pArray = pcVar25;
          pVVar14->nCap = (int)sVar29;
        }
LAB_00569aab:
        iVar6 = pVVar14->nSize;
        pVVar14->nSize = iVar6 + 1;
        pVVar14->pArray[iVar6] = ')';
        uVar8 = pVVar14->nCap;
        if (pVVar14->nSize == uVar8) {
          if ((int)uVar8 < 0x10) {
            if (pVVar14->pArray == (char *)0x0) {
              pcVar25 = (char *)malloc(0x10);
            }
            else {
              pcVar25 = (char *)realloc(pVVar14->pArray,0x10);
            }
            sVar29 = 0x10;
          }
          else {
            sVar29 = (ulong)uVar8 * 2;
            if ((int)sVar29 <= (int)uVar8) goto LAB_00569b15;
            if (pVVar14->pArray == (char *)0x0) {
              pcVar25 = (char *)malloc(sVar29);
            }
            else {
              pcVar25 = (char *)realloc(pVVar14->pArray,sVar29);
            }
          }
          pVVar14->pArray = pcVar25;
          pVVar14->nCap = (int)sVar29;
        }
LAB_00569b15:
        iVar6 = pVVar14->nSize;
        pVVar14->nSize = iVar6 + 1;
        pVVar14->pArray[iVar6] = '\0';
        uVar30 = 0x18;
        __ptr = (Literal_t *)malloc(0x18);
        __ptr->function = puVar11;
        __ptr->transition = puVar13;
        __ptr->expression = pVVar14;
        vecLit[uVar34] = __ptr;
        vecLit[uVar17] = (Literal_t *)0x0;
        if (verbose != 0) {
          Abc_Print((int)uVar30,"New Literal Cluster found: ");
          Abc_Print((int)uVar30,"%s",__ptr->expression->pArray);
          Abc_Print((int)uVar30," -> ");
          iVar6 = (int)uVar30;
          if (0 < nVars) {
            puVar11 = __ptr->function;
            lVar22 = (ulong)(uint)nVars + 1;
            do {
              Abc_Print((int)uVar30,"%08X",(ulong)puVar11[lVar22 + -2]);
              iVar6 = (int)uVar30;
              lVar22 = lVar22 + -1;
            } while (1 < lVar22);
          }
          Abc_Print(iVar6,"\n");
        }
        pLVar16 = Rpo_Recursion(target,vecLit,nLit,nLitCount + -1,nVars,thresholdCount,thresholdMax,
                                verbose);
        if (__ptr->function != (uint *)0x0) {
          free(__ptr->function);
          __ptr->function = (uint *)0x0;
        }
        if (__ptr->transition != (uint *)0x0) {
          free(__ptr->transition);
          __ptr->transition = (uint *)0x0;
        }
        pVVar14 = __ptr->expression;
        if (pVVar14->pArray != (char *)0x0) {
          free(pVVar14->pArray);
          pVVar14->pArray = (char *)0x0;
        }
        if (pVVar14 != (Vec_Str_t *)0x0) {
          free(pVVar14);
        }
        free(__ptr);
        vecLit[uVar34] = pLVar27;
        vecLit[uVar17] = pLVar10;
        if ((*thresholdCount == thresholdMax) || (pLVar16 != (Literal_t *)0x0)) goto LAB_00569d47;
      }
      if (verbose == 0) {
        pLVar16 = (Literal_t *)0x0;
      }
      else {
        pLVar16 = (Literal_t *)0x0;
        Abc_Print((int)ppRVar28,"There is no edges unvisited... Exiting recursion.\n");
      }
LAB_00569d47:
      if (vertexDegree != (int *)0x0) {
        free(vertexDegree);
      }
      if (0 < (int)local_cc) {
        uVar34 = 0;
        do {
          if (edges[uVar34] != (Rpo_LCI_Edge_t *)0x0) {
            free(edges[uVar34]);
            edges[uVar34] = (Rpo_LCI_Edge_t *)0x0;
          }
          uVar34 = uVar34 + 1;
        } while (local_cc != uVar34);
      }
      if (edges == (Rpo_LCI_Edge_t **)0x0) {
        return pLVar16;
      }
      free(edges);
      return pLVar16;
    }
    if (verbose != 0) {
      Abc_Print((int)puVar11,"Checking solution: ");
    }
    iVar6 = (int)puVar11;
    if (0 < nLit) {
      uVar5 = 1 << ((char)nVars - 5U & 0x1f);
      if (nVars < 6) {
        uVar5 = 1;
      }
      uVar33 = (ulong)uVar5;
      uVar17 = 0;
      do {
        pLVar27 = vecLit[uVar17];
        if (pLVar27 != (Literal_t *)0x0) {
          puVar13 = pLVar27->function;
          uVar21 = uVar33;
          do {
            iVar6 = (int)uVar21;
            if (iVar6 < 1) goto LAB_00569540;
            lVar19 = uVar21 - 1;
            puVar11 = (uint *)(ulong)target[lVar19];
            lVar22 = uVar21 - 1;
            uVar21 = uVar21 - 1;
          } while (target[lVar19] == puVar13[lVar22]);
          if (iVar6 < 1) {
LAB_00569540:
            pLVar10 = (Literal_t *)malloc(0x18);
            puVar11 = (uint *)malloc((long)(int)uVar5 * 4);
            pLVar10->function = puVar11;
            if (0 < (int)uVar5) {
              lVar19 = uVar33 + 1;
              do {
                puVar11[lVar19 + -2] = puVar13[lVar19 + -2];
                lVar19 = lVar19 + -1;
              } while (1 < lVar19);
            }
            puVar11 = (uint *)malloc((long)(int)uVar5 * 4);
            pLVar10->transition = puVar11;
            if (0 < (int)uVar5) {
              puVar13 = pLVar27->transition;
              lVar19 = uVar33 + 1;
              do {
                puVar11[lVar19 + -2] = puVar13[lVar19 + -2];
                lVar19 = lVar19 + -1;
              } while (1 < lVar19);
            }
            pVVar14 = pLVar27->expression;
            pVVar12 = (Vec_Str_t *)malloc(0x10);
            iVar6 = pVVar14->nSize;
            pVVar12->nSize = iVar6;
            iVar7 = pVVar14->nCap;
            pVVar12->nCap = iVar7;
            if ((long)iVar7 == 0) {
              pcVar25 = (char *)0x0;
            }
            else {
              pcVar25 = (char *)malloc((long)iVar7);
            }
            pVVar12->pArray = pcVar25;
            memcpy(pcVar25,pVVar14->pArray,(long)iVar6);
            iVar6 = (int)pcVar25;
            pLVar10->expression = pVVar12;
            if (verbose == 0) {
              return pLVar10;
            }
            pcVar25 = "FOUND!\n";
            goto LAB_00569d3b;
          }
        }
        iVar6 = (int)puVar11;
        uVar17 = uVar17 + 1;
      } while (uVar17 != uVar34);
    }
    if (verbose != 0) {
      pcVar25 = "FAILED!\n";
      pLVar10 = (Literal_t *)0x0;
LAB_00569d3b:
      Abc_Print(iVar6,pcVar25,thresholdCount);
      return pLVar10;
    }
  }
  return (Literal_t *)0x0;
}

Assistant:

Literal_t* Rpo_Recursion(unsigned* target, Literal_t** vecLit, int nLit, int nLitCount, int nVars, int* thresholdCount, int thresholdMax, int verbose) {
    int i, j, k;
    Literal_t* copyResult;
    int* vertexDegree;
    int v;
    int edgeSize;
    Rpo_LCI_Edge_t** edges;
    int edgeCount = 0;
    int isAnd;
    int isOr;
    Rpo_LCI_Edge_t* edge;
    Literal_t* result = NULL;
    int edgeIndex;
    int minLitIndex;
    int maxLitIndex;
    Literal_t* oldLit1;
    Literal_t* oldLit2;
    Literal_t* newLit;

    *thresholdCount = *thresholdCount + 1;
    if (*thresholdCount == thresholdMax) {
        return NULL;
    }
    if (verbose) {
        Abc_Print(-2, "Entering recursion %d\n", *thresholdCount);
    }
    // verify if solution is the target or not
    if (nLitCount == 1) {
        if (verbose) {
            Abc_Print(-2, "Checking solution: ");
        }
        for (k = 0; k < nLit; ++k) {
            if (vecLit[k] != NULL) {
                if (Kit_TruthIsEqual(target, vecLit[k]->function, nVars)) {
                    copyResult = Lit_Copy(vecLit[k], nVars);
                    if (verbose) {
                        Abc_Print(-2, "FOUND!\n", thresholdCount);
                    }
                    thresholdCount = 0; //??
                    return copyResult;
                }
            }
        }
        if (verbose) {
            Abc_Print(-2, "FAILED!\n", thresholdCount);
        }
        return NULL;
    }

    vertexDegree = ABC_ALLOC(int, nLit);
    //    if(verbose) {
    //        Abc_Print(-2,"Allocating vertexDegree...\n");
    //    }
    for (v = 0; v < nLit; v++) {
        vertexDegree[v] = 0;
    }
    // building edges
    edgeSize = (nLit * (nLit - 1)) / 2;
    edges = ABC_ALLOC(Rpo_LCI_Edge_t*, edgeSize);
    if (verbose) {
        Abc_Print(-2, "Creating Edges: \n");
    }

    for (i = 0; i < nLit; ++i) {
        if (vecLit[i] == NULL) {
            continue;
        }
        for (j = i; j < nLit; ++j) {
            if (vecLit[j] == NULL) {
                continue;
            }
            isAnd = Rpo_CheckANDGroup(vecLit[i], vecLit[j], nVars);
            isOr = Rpo_CheckORGroup(vecLit[i], vecLit[j], nVars);
            if (isAnd) {
                if (verbose) {
                    Abc_Print(-2, "Grouped: ");
                    Lit_PrintExp(vecLit[j]);
                    Abc_Print(-2, " AND ");
                    Lit_PrintExp(vecLit[i]);
                    Abc_Print(-2, "\n");
                }
                // add edge
                edge = Rpo_CreateEdge(LIT_AND, i, j, vertexDegree);
                edges[edgeCount++] = edge;
            }
            if (isOr) {
                if (verbose) {
                    Abc_Print(-2, "Grouped: ");
                    Lit_PrintExp(vecLit[j]);
                    Abc_Print(-2, " OR ");
                    Lit_PrintExp(vecLit[i]);
                    Abc_Print(-2, "\n");
                }
                // add edge
                edge = Rpo_CreateEdge(LIT_OR, i, j, vertexDegree);
                edges[edgeCount++] = edge;
            }
        }
    }
    if (verbose) {
        Abc_Print(-2, "%d edges created.\n", edgeCount);
    }


    //traverse the edges, grouping new Literal Clusters
    do {
        edgeIndex = Rpo_computeMinEdgeCost(edges, edgeCount, vertexDegree);
        if (edgeIndex < 0) {
            if (verbose) {
                Abc_Print(-2, "There is no edges unvisited... Exiting recursion.\n");
                //exit(-1);
            }
            break;
            //return NULL; // the graph does not have unvisited edges
        }
        edge = edges[edgeIndex];
        edge->visited = 1;
        //Rpo_PrintEdge(edge);
        minLitIndex = (edge->idx1 < edge->idx2) ? edge->idx1 : edge->idx2;
        maxLitIndex = (edge->idx1 > edge->idx2) ? edge->idx1 : edge->idx2;
        oldLit1 = vecLit[minLitIndex];
        oldLit2 = vecLit[maxLitIndex];
        newLit = Lit_GroupLiterals(oldLit1, oldLit2, (Operator_t)edge->connectionType, nVars);
        vecLit[minLitIndex] = newLit;
        vecLit[maxLitIndex] = NULL;

        if (verbose) {
            Abc_Print(-2, "New Literal Cluster found: ");
            Lit_PrintExp(newLit);
            Abc_Print(-2, " -> ");
            Lit_PrintTT(newLit->function, nVars);
            Abc_Print(-2, "\n");
        }
        result = Rpo_Recursion(target, vecLit, nLit, (nLitCount - 1), nVars, thresholdCount, thresholdMax, verbose);
        //independent of result, free the newLit and restore the vector of Literal Clusters
        Lit_Free(newLit);
        vecLit[minLitIndex] = oldLit1;
        vecLit[maxLitIndex] = oldLit2;
        if (*thresholdCount == thresholdMax) {
            break;
        }
    } while (result == NULL);
    //freeing memory
    //    if(verbose) {
    //        Abc_Print(-2,"Freeing vertexDegree...\n");
    //    }
    ABC_FREE(vertexDegree);
    for (i = 0; i < edgeCount; ++i) {
        //Abc_Print(-2, "%p ", edges[i]);
        ABC_FREE(edges[i]);
    }
    ABC_FREE(edges);
    return result;
}